

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::BuildSystem::loadDescription(BuildSystem *this,StringRef mainFilename)

{
  BuildSystemImpl *this_00;
  StringRef filename;
  StringRef mainFilename_00;
  __uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  __p_00;
  pointer __p;
  unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  description;
  __uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  local_60;
  string local_58;
  StringRef local_38;
  
  local_38.Length = mainFilename.Length;
  local_38.Data = mainFilename.Data;
  this_00 = (BuildSystemImpl *)this->impl;
  llvm::StringRef::str_abi_cxx11_(&local_58,&local_38);
  std::__cxx11::string::operator=((string *)&this_00->mainFilename,(string *)&local_58);
  std::__cxx11::string::_M_dispose();
  mainFilename_00.Length = local_38.Length;
  mainFilename_00.Data = local_38.Data;
  BuildFile::BuildFile
            ((BuildFile *)&local_58,mainFilename_00,&(this_00->fileDelegate).super_BuildFileDelegate
            );
  BuildFile::load((BuildFile *)&local_60);
  BuildFile::~BuildFile((BuildFile *)&local_58);
  __p_00._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl =
       local_60._M_t.
       super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
       .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl;
  if (local_60._M_t.
      super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
      .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl ==
      (_Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
       )0x0) {
    filename.Data = (this_00->mainFilename)._M_dataplus._M_p;
    filename.Length = (this_00->mainFilename)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_58,"unable to load build file");
    anon_unknown.dwarf_2cfb1b::BuildSystemImpl::error(this_00,filename,(Twine *)&local_58);
  }
  else {
    local_60._M_t.
    super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
    .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl =
         (tuple<llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
          )(_Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
            )0x0;
    std::
    __uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
    ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
             *)&this_00->buildDescription,
            (pointer)__p_00._M_t.
                     super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
                     .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>.
                     _M_head_impl);
  }
  std::
  unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
  ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
                 *)&local_60);
  return __p_00._M_t.
         super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
         .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl !=
         (_Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
          )0x0;
}

Assistant:

bool BuildSystem::loadDescription(StringRef mainFilename) {
  return static_cast<BuildSystemImpl*>(impl)->loadDescription(mainFilename);
}